

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

RepeatedField<int> *
google::protobuf::Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
Construct<google::protobuf::Arena*>(void *ptr,Arena **args)

{
  Arena **args_local;
  void *ptr_local;
  
  RepeatedField<int>::RepeatedField((RepeatedField<int> *)ptr,*args);
  return (RepeatedField<int> *)ptr;
}

Assistant:

static T* Construct(void* ptr, Args&&... args) {
      return new (ptr) T(static_cast<Args&&>(args)...);
    }